

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O3

void __thiscall ResourceManager::ResourceManager(ResourceManager *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ResourceBase)._vptr_ResourceBase = (_func_int **)&PTR__ResourceManager_0027b0b8;
  p_Var1 = &(this->textures_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->textures_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->textures_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->fonts_)._M_t._M_impl.super__Rb_tree_header;
  (this->textures_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->fonts_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->fonts_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->fonts_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fonts_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fonts_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->shaders_)._M_t._M_impl.super__Rb_tree_header;
  (this->fonts_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->shaders_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->shaders_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->shaders_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->shaders_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->shaders_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->shaders_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ResourceManager::ResourceManager() :
    textures_(),
    fonts_(),
    shaders_() {
}